

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-bs.cpp
# Opt level: O2

void renderSceneTs(int offset)

{
  if (g_patch.flags.reset) {
    loadSubdivisionBuffers();
    g_patch.pingPong = 0;
    (*glad_glDrawArrays)(0xe,0,1);
    g_patch.flags.reset = false;
  }
  else {
    (*glad_glMemoryBarrier)(0x1000);
    (*glad_glBindBufferBase)
              (0x90d2,3,*(GLuint *)((long)&g_gl + (4 - (long)g_patch.pingPong) * 4 + 0x2c));
    (*glad_glBindBufferBase)(0x90d2,4,g_gl.buffers[(long)g_patch.pingPong + 3]);
    (*glad_glDrawArraysIndirect)(0xe,(void *)offset);
    g_patch.pingPong = 1 - g_patch.pingPong;
  }
  return;
}

Assistant:

void renderSceneTs(int offset) {
    // render terrain
    if (g_patch.flags.reset) {
        loadSubdivisionBuffers();
        g_patch.pingPong = 0;

        glDrawArrays(GL_PATCHES, 0, 1);

        g_patch.flags.reset = false;
    } else {
        glMemoryBarrier(GL_ATOMIC_COUNTER_BARRIER_BIT);
        glBindBufferBase(GL_SHADER_STORAGE_BUFFER,
                         BUFFER_SUBD1,
                         g_gl.buffers[BUFFER_SUBD1 + 1 - g_patch.pingPong]);
        glBindBufferBase(GL_SHADER_STORAGE_BUFFER,
                         BUFFER_SUBD2,
                         g_gl.buffers[BUFFER_SUBD1 + g_patch.pingPong]);
        glDrawArraysIndirect(GL_PATCHES, BUFFER_OFFSET(offset));
        g_patch.pingPong = 1 - g_patch.pingPong;
    }
}